

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

CharCount __thiscall
UnifiedRegex::ConcatNode::TransferPass0(ConcatNode *this,Compiler *compiler,Char *litbuf)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 rhs;
  ThreadContext *this_00;
  undefined4 *puVar4;
  ConcatNode *local_38;
  ConcatNode *curr;
  ConcatNode *prev;
  CharCount n;
  Char *litbuf_local;
  Compiler *compiler_local;
  ConcatNode *this_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (this->tail == (ConcatNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x70a,"(tail != 0)","tail != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  prev._4_4_ = 0;
  curr = (ConcatNode *)0x0;
  local_38 = this;
  do {
    if (local_38 == (ConcatNode *)0x0) {
      return prev._4_4_;
    }
    if (local_38->head->tag == Concat) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x711,"(curr->head->tag != Concat)","curr->head->tag != Concat");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (curr != (ConcatNode *)0x0) {
      iVar3 = (**curr->head->_vptr_Node)();
      if (iVar3 != 0) {
        iVar3 = (**local_38->head->_vptr_Node)();
        if (iVar3 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0x712,
                             "(prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0))"
                             ,
                             "prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    rhs = (*local_38->head->_vptr_Node[3])(local_38->head,compiler,litbuf);
    prev._4_4_ = UInt32Math::Add(prev._4_4_,rhs);
    curr = local_38;
    local_38 = local_38->tail;
  } while( true );
}

Assistant:

CharCount ConcatNode::TransferPass0(Compiler& compiler, const Char* litbuf)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(tail != 0);
        CharCount n = 0;
#if DBG
        ConcatNode* prev = 0;
#endif
        for (ConcatNode* curr = this; curr != 0; curr = curr->tail)
        {
            Assert(curr->head->tag != Concat);
            Assert(prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0));
            n = UInt32Math::Add(n, curr->head->TransferPass0(compiler, litbuf));
#if DBG
            prev = curr;
#endif
        }
        return n;
    }